

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::submitBufferWaitManySemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  VkEvent obj;
  deUint64 *pdVar2;
  VkResult VVar3;
  int iVar4;
  VkDevice device;
  DeviceInterface *vk;
  PFN_vkReallocationFunction p_Var5;
  long lVar6;
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkSubmitInfo submitInfo2;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  Move<vk::Handle<(vk::HandleType)4>_> semaphoreArray [10];
  VkSemaphore semaphores [10];
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)4>_> local_348;
  TestStatus *local_320;
  PFN_vkInternalAllocationNotification local_318;
  long *plStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  string *local_2e8;
  VkQueue local_2e0;
  VkFence local_2d8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_2d0;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_2b0;
  VkAllocationCallbacks *local_298;
  DeviceInterface *pDStack_290;
  VkAllocationCallbacks local_288;
  undefined1 *local_258;
  VkCommandPool local_248;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_240;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  VkCommandPoolCreateInfo local_200;
  RefData<vk::Handle<(vk::HandleType)10>_> local_1e8 [9];
  deUint64 local_c8;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_c0;
  undefined1 local_a8 [88];
  VkCommandBufferAllocateInfo local_50;
  
  local_320 = __return_storage_ptr__;
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_2e0 = Context::getUniversalQueue(context);
  local_200.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_200.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_200.pNext = (void *)0x0;
  local_200.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_1e8,vk,device,&local_200,
             (VkAllocationCallbacks *)0x0);
  local_248.m_internal = local_1e8[0].object.m_internal;
  local_50.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.commandPool.m_internal = local_1e8[0].object.m_internal;
  local_50.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_50.commandBufferCount = 1;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_1e8,vk,device,&local_50);
  plStack_310 = (long *)CONCAT44(local_1e8[0].deleter.m_deviceIface._4_4_,
                                 local_1e8[0].deleter.m_deviceIface._0_4_);
  local_308 = CONCAT44(local_1e8[0].deleter.m_device._4_4_,local_1e8[0].deleter.m_device._0_4_);
  uStack_300 = CONCAT44(local_1e8[0].deleter.m_allocator._4_4_,
                        local_1e8[0].deleter.m_allocator._0_4_);
  local_318 = (PFN_vkInternalAllocationNotification)local_1e8[0].object.m_internal;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0x2a;
  uStack_220 = 0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)local_1e8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_2b0.m_device._0_4_ = local_1e8[0].deleter.m_device._0_4_;
  DStack_2b0.m_device._4_4_ = local_1e8[0].deleter.m_device._4_4_;
  DStack_2b0.m_allocator._0_4_ = local_1e8[0].deleter.m_allocator._0_4_;
  DStack_2b0.m_allocator._4_4_ = local_1e8[0].deleter.m_allocator._4_4_;
  local_2b8 = (undefined4)local_1e8[0].object.m_internal;
  uStack_2b4 = local_1e8[0].object.m_internal._4_4_;
  DStack_2b0.m_deviceIface._0_4_ = local_1e8[0].deleter.m_deviceIface._0_4_;
  DStack_2b0.m_deviceIface._4_4_ = local_1e8[0].deleter.m_deviceIface._4_4_;
  VVar3 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,local_1e8[0].object.m_internal);
  ::vk::checkResult(VVar3,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6c);
  VVar3 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_318,&local_228);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6f);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,local_318,CONCAT44(uStack_2b4,local_2b8),0x10000);
  VVar3 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_318);
  ::vk::checkResult(VVar3,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd77);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_1e8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_2d8.m_internal = local_1e8[0].object.m_internal;
  lVar6 = 0;
  memset(local_1e8,0,0x140);
  pdVar2 = &local_1e8[0].object.m_internal;
  do {
    ::vk::createSemaphore(&local_348,vk,device,0,(VkAllocationCallbacks *)0x0);
    local_288.pUserData =
         local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
    local_288.pfnAllocation =
         (PFN_vkAllocationFunction)
         local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
    local_298 = (VkAllocationCallbacks *)
                local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
    pDStack_290 = local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                  m_deviceIface;
    local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
    local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (*pdVar2 != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)4>_> *)(pdVar2 + 1),(VkSemaphore)*pdVar2);
    }
    pdVar2[2] = (deUint64)local_288.pUserData;
    pdVar2[3] = (deUint64)local_288.pfnAllocation;
    *pdVar2 = (deUint64)local_298;
    ((Deleter<vk::Handle<(vk::HandleType)4>_> *)(pdVar2 + 1))->m_deviceIface = pDStack_290;
    if (local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                (&local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter,
                 (VkSemaphore)
                 local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal);
    }
    *(deUint64 *)(local_a8 + lVar6 * 8) = *pdVar2;
    lVar6 = lVar6 + 1;
    pdVar2 = pdVar2 + 4;
  } while (lVar6 != 10);
  local_298 = (VkAllocationCallbacks *)CONCAT44(local_298._4_4_,4);
  pDStack_290 = (DeviceInterface *)0x0;
  local_288.pUserData = (void *)((ulong)local_288.pUserData & 0xffffffff00000000);
  local_288.pfnAllocation = (PFN_vkAllocationFunction)0x0;
  local_288.pfnReallocation = (PFN_vkReallocationFunction)0x0;
  local_288.pfnFree._0_4_ = 1;
  local_288.pfnInternalAllocation = (PFN_vkInternalAllocationNotification)&local_318;
  local_288.pfnInternalFree._0_4_ = 10;
  local_258 = local_a8;
  VVar3 = (*vk->_vptr_DeviceInterface[2])(vk,local_2e0,1,&local_298,local_2d8.m_internal);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1u, &submitInfo1, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd96);
  VVar3 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2d8,0,0xffffffffffffffff);
  ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd99);
  iVar4 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,CONCAT44(uStack_2b4,local_2b8));
  if (iVar4 == 3) {
    VVar3 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,CONCAT44(uStack_2b4,local_2b8));
    ::vk::checkResult(VVar3,"vk.resetEvent(vkDevice, *event)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda1);
    VVar3 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_2d8);
    ::vk::checkResult(VVar3,"vk.resetFences(vkDevice, 1u, &fence.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda4);
  }
  else {
    ppVVar1 = &local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
    local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal =
         (deUint64)ppVVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"Submit Buffer and Wait for Many Semaphores Test FAILED","");
    local_320->m_code = QP_TEST_RESULT_FAIL;
    (local_320->m_description)._M_dataplus._M_p = (pointer)&(local_320->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320->m_description,
               local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal));
    if ((VkDevice *)local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal
        != ppVVar1) {
      operator_delete((void *)local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.
                              m_internal,
                      (ulong)(local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter
                              .m_device + 1));
    }
  }
  if (iVar4 == 3) {
    p_Var5 = (PFN_vkReallocationFunction)operator_new(0x14);
    lVar6 = 0;
    do {
      *(undefined4 *)(p_Var5 + lVar6) = 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x14);
    local_2e8 = (string *)&local_320->m_description;
    local_2f0 = &(local_320->m_description).field_2;
    lVar6 = 0;
    do {
      local_298 = (VkAllocationCallbacks *)CONCAT44(local_298._4_4_,4);
      pDStack_290 = (DeviceInterface *)0x0;
      local_288.pUserData = (void *)CONCAT44(local_288.pUserData._4_4_,5);
      local_288.pfnAllocation = (PFN_vkAllocationFunction)(local_a8 + lVar6);
      local_288.pfnFree._0_4_ = 1;
      local_288.pfnInternalAllocation = (PFN_vkInternalAllocationNotification)&local_318;
      local_288.pfnInternalFree._0_4_ = 0;
      local_258 = (undefined1 *)0x0;
      local_288.pfnReallocation = p_Var5;
      VVar3 = (*vk->_vptr_DeviceInterface[2])(vk,local_2e0,1,&local_298,local_2d8.m_internal);
      ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1u, &submitInfo2, *fence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbc);
      VVar3 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2d8,0,1000000000);
      ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbf);
      iVar4 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,CONCAT44(uStack_2b4,local_2b8));
      if (iVar4 == 3) {
        VVar3 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_2d8);
        ::vk::checkResult(VVar3,"vk.resetFences(vkDevice, 1u, &fence.get())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                          ,0xdc8);
        VVar3 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,CONCAT44(uStack_2b4,local_2b8));
        ::vk::checkResult(VVar3,"vk.resetEvent(vkDevice, *event)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                          ,0xdcb);
      }
      else {
        local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal =
             (deUint64)
             &local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_348,"Submit Buffer and Wait for Many Semaphores Test FAILED","")
        ;
        local_320->m_code = QP_TEST_RESULT_FAIL;
        (local_320->m_description)._M_dataplus._M_p = (pointer)local_2f0;
        std::__cxx11::string::_M_construct<char*>
                  (local_2e8,
                   local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal,
                   (undefined1 *)
                   ((long)&(local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                   local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal)
                  );
        if ((VkDevice *)
            local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal !=
            &local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device) {
          operator_delete((void *)local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                                  object.m_internal,
                          (ulong)(local_348.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                                  deleter.m_device + 1));
        }
      }
      if (iVar4 != 3) goto LAB_0045e2e1;
      lVar6 = lVar6 + 0x28;
    } while (lVar6 == 0x28);
    local_298 = &local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"Submit Buffer and Wait for Many Semaphores Test succeeded","");
    local_320->m_code = QP_TEST_RESULT_PASS;
    (local_320->m_description)._M_dataplus._M_p = (pointer)local_2f0;
    std::__cxx11::string::_M_construct<char*>
              (local_2e8,local_298,(long)&local_298->pUserData + (long)pDStack_290);
    if (local_298 != &local_288) {
      operator_delete(local_298,(long)local_288.pUserData + 1);
    }
LAB_0045e2e1:
    operator_delete(p_Var5,0x14);
  }
  lVar6 = 0;
  do {
    if (*(deUint64 *)((long)&local_c8 + lVar6) != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)4>_> *)((long)&DStack_c0.m_deviceIface + lVar6)
                 ,(VkSemaphore)*(deUint64 *)((long)&local_c8 + lVar6));
    }
    *(undefined8 *)(local_a8 + lVar6 + -0x10) = 0;
    *(undefined8 *)(local_a8 + lVar6 + -8) = 0;
    *(undefined8 *)((long)&local_c8 + lVar6) = 0;
    *(undefined8 *)((long)&DStack_c0.m_deviceIface + lVar6) = 0;
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x140);
  if (local_2d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_2d0,local_2d8);
  }
  obj.m_internal._4_4_ = uStack_2b4;
  obj.m_internal._0_4_ = local_2b8;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_2b0,obj);
  }
  if (local_318 != (PFN_vkInternalAllocationNotification)0x0) {
    local_1e8[0].object.m_internal = (deUint64)local_318;
    (**(code **)(*plStack_310 + 0x240))(plStack_310,local_308,uStack_300,1);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_240,local_248);
  }
  return local_320;
}

Assistant:

tcu::TestStatus submitBufferWaitManySemaphores(Context& context)
{
	// This test will create numSemaphores semaphores, and signal them in NUM_SEMAPHORES submits to queue
	// After that the numSubmissions queue submissions will wait for each semaphore

	const deUint32							numSemaphores			= 10u;  // it must be multiply of numSubmission
	const deUint32							numSubmissions			= 2u;
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// VkCommandPoolCreateFlags		flags;
		queueFamilyIndex,											// deUint32						queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		*cmdPool,													// VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// VkCommandBufferLevel			level;
		1u,															// uint32_t						bufferCount;
	};

	// Create command buffer
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0,															// flags
		DE_NULL														// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	// create event that will be used to check if command buffers has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event - at creation state is undefined
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	// numSemaphores is declared const, so this array can be static
	// the semaphores will be destroyed automatically at end of scope
	Move <VkSemaphore>						semaphoreArray[numSemaphores];
	VkSemaphore								semaphores[numSemaphores];

	for (deUint32 idx = 0; idx < numSemaphores; ++idx) {
		// create semaphores for use in this test
		semaphoreArray[idx] = createSemaphore(vk, vkDevice);
		semaphores[idx] = semaphoreArray[idx].get();
	};

	{
		// create submit info for buffer - signal semaphores
		const VkSubmitInfo submitInfo1 =
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,							// sType
			DE_NULL,												// pNext
			0u,														// waitSemaphoreCount
			DE_NULL,												// pWaitSemaphores
			DE_NULL,												// pWaitDstStageMask
			1,														// commandBufferCount
			&primCmdBuf.get(),										// pCommandBuffers
			numSemaphores,											// signalSemaphoreCount
			semaphores												// pSignalSemaphores
		};
		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo1, *fence));

		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

		// check if buffer has been executed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));
	}

	const deUint32							numberOfSemaphoresToBeWaitedByOneSubmission	= numSemaphores / numSubmissions;
	const std::vector<VkPipelineStageFlags>	waitDstStageFlags							(numberOfSemaphoresToBeWaitedByOneSubmission, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);

	// the following code waits for the semaphores set above - numSubmissions queues will wait for each semaphore from above
	for (deUint32 idxSubmission = 0; idxSubmission < numSubmissions; ++idxSubmission) {

		// create submit info for buffer - waiting for semaphore
		const VkSubmitInfo				submitInfo2				=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,												// sType
			DE_NULL,																	// pNext
			numberOfSemaphoresToBeWaitedByOneSubmission,								// waitSemaphoreCount
			semaphores + (numberOfSemaphoresToBeWaitedByOneSubmission * idxSubmission),	// pWaitSemaphores
			waitDstStageFlags.data(),													// pWaitDstStageMask
			1,																			// commandBufferCount
			&primCmdBuf.get(),															// pCommandBuffers
			0u,																			// signalSemaphoreCount
			DE_NULL,																	// pSignalSemaphores
		};

		// Submit the second command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo2, *fence));

		// wait for 1 second.
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000));

		// check if second buffer has been executed
		// if it has been executed, it means that the semaphore was signalled - so test if passed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));
	}

	return tcu::TestStatus::pass("Submit Buffer and Wait for Many Semaphores Test succeeded");
}